

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSprintfElementContent(void)

{
  int iVar1;
  int iVar2;
  xmlElementContentPtr val;
  uint local_34;
  int n_englob;
  int englob;
  int n_content;
  xmlElementContentPtr content;
  int n_buf;
  char *buf;
  int mem_base;
  int test_ret;
  
  buf._4_4_ = 0;
  for (content._4_4_ = 0; (int)content._4_4_ < 1; content._4_4_ = content._4_4_ + 1) {
    for (n_englob = 0; n_englob < 1; n_englob = n_englob + 1) {
      for (local_34 = 0; (int)local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlElementContentPtr(n_englob,1);
        iVar2 = gen_int(local_34,2);
        xmlSprintfElementContent(0,val,iVar2);
        call_tests = call_tests + 1;
        des_xmlElementContentPtr(n_englob,val,1);
        des_int(local_34,iVar2,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSprintfElementContent",(ulong)(uint)(iVar2 - iVar1))
          ;
          buf._4_4_ = buf._4_4_ + 1;
          printf(" %d",(ulong)content._4_4_);
          printf(" %d",(ulong)(uint)n_englob);
          printf(" %d",(ulong)local_34);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return buf._4_4_;
}

Assistant:

static int
test_xmlSprintfElementContent(void) {
    int test_ret = 0;

#if defined(LIBXML_OUTPUT_ENABLED)
#ifdef LIBXML_OUTPUT_ENABLED
    int mem_base;
    char * buf; /* an output buffer */
    int n_buf;
    xmlElementContentPtr content; /* An element table */
    int n_content;
    int englob; /* 1 if one must print the englobing parenthesis, 0 otherwise */
    int n_englob;

    for (n_buf = 0;n_buf < gen_nb_char_ptr;n_buf++) {
    for (n_content = 0;n_content < gen_nb_xmlElementContentPtr;n_content++) {
    for (n_englob = 0;n_englob < gen_nb_int;n_englob++) {
        mem_base = xmlMemBlocks();
        buf = gen_char_ptr(n_buf, 0);
        content = gen_xmlElementContentPtr(n_content, 1);
        englob = gen_int(n_englob, 2);

        xmlSprintfElementContent(buf, content, englob);
        call_tests++;
        des_char_ptr(n_buf, buf, 0);
        des_xmlElementContentPtr(n_content, content, 1);
        des_int(n_englob, englob, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSprintfElementContent",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buf);
            printf(" %d", n_content);
            printf(" %d", n_englob);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif
#endif

    return(test_ret);
}